

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

void pfd_open_confirmation(Channel *chan)

{
  PortForwarding *pf;
  Channel *chan_local;
  
  if (chan->vt == &PortForwarding_channelvt) {
    *(undefined1 *)((long)&chan[-3].vt + 1) = 1;
    sk_set_frozen(*(Socket **)&chan[-4].initial_fixed_window_size,false);
    sk_write(*(Socket **)&chan[-4].initial_fixed_window_size,(void *)0x0,0);
    if (*(long *)&chan[-2].initial_fixed_window_size != 0) {
      sshfwd_write(*(SshChannel **)&chan[-5].initial_fixed_window_size,
                   (void *)((long)&(chan[-1].vt)->free +
                           *(long *)(*(long *)&chan[-2].initial_fixed_window_size + 8)),
                   *(long *)(*(long *)&chan[-2].initial_fixed_window_size + 0x10) -
                   (long)chan[-1].vt);
      strbuf_free(*(strbuf **)&chan[-2].initial_fixed_window_size);
      *(undefined8 *)&chan[-2].initial_fixed_window_size = 0;
    }
    return;
  }
  __assert_fail("chan->vt == &PortForwarding_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c",
                0x29a,"void pfd_open_confirmation(Channel *)");
}

Assistant:

static void pfd_open_confirmation(Channel *chan)
{
    assert(chan->vt == &PortForwarding_channelvt);
    PortForwarding *pf = container_of(chan, PortForwarding, chan);

    pf->ready = true;
    sk_set_frozen(pf->s, false);
    sk_write(pf->s, NULL, 0);
    if (pf->socksbuf) {
        sshfwd_write(pf->c, pf->socksbuf->u + pf->socksbuf_consumed,
                     pf->socksbuf->len - pf->socksbuf_consumed);
        strbuf_free(pf->socksbuf);
        pf->socksbuf = NULL;
    }
}